

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::
InOutFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
::runTest(InOutFuncCase<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *this)

{
  deInt32 *pdVar1;
  long *plVar2;
  long lVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  undefined4 extraout_var;
  StatementP stmt;
  ExprP<tcu::Matrix<float,_3,_2>_> expr;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  variables;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  inputs;
  Variable<deqp::gls::BuiltinPrecisionTests::Void> *in_stack_fffffffffffffee8;
  SharedPtrStateBase *local_110;
  string local_108;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  local_e8;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_88;
  
  iVar5 = (*(this->super_FuncCaseBase).super_PrecisionCase.super_TestCase.super_TestNode.
            _vptr_TestNode[6])();
  generateInputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
            (&local_88,(BuiltinPrecisionTests *)CONCAT44(extraout_var,iVar5),
             (Samplings<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
              *)&(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.floatFormat,
             (FloatFormat *)(ulong)(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.precision,
             (Precision)(this->super_FuncCaseBase).super_PrecisionCase.m_ctx.numRandoms,
             (size_t)&(this->super_FuncCaseBase).super_PrecisionCase.m_rnd,
             (Random *)in_stack_fffffffffffffee8);
  local_e8.out1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
  local_e8.out1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (SharedPtrStateBase *)0x0;
  local_e8.out0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
  local_e8.out0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (SharedPtrStateBase *)0x0;
  local_e8.in3.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  local_e8.in3.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = (SharedPtrStateBase *)0x0;
  local_e8.in2.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  local_e8.in2.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = (SharedPtrStateBase *)0x0;
  local_e8.in1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
  local_e8.in1.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
  .m_state = (SharedPtrStateBase *)0x0;
  local_e8.in0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
  local_e8.in0.
  super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
  m_state = (SharedPtrStateBase *)0x0;
  paVar4 = &local_108.field_2;
  local_108._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"out0","");
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_108);
  if (local_e8.out0.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
      m_state != local_110) {
    if (local_e8.out0.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
        .m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e8.out0.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                .m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8.out0.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
        .m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
        (*(local_e8.out0.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e8.out0.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                .m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_e8.out0.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_e8.out0.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_e8.out0.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
    m_state = local_110;
    local_e8.out0.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
    m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)in_stack_fffffffffffffee8;
    if (local_110 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_110->strongRefCount = local_110->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_110->weakRefCount = local_110->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      in_stack_fffffffffffffee8 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_110 != (SharedPtrStateBase *)0x0) {
        (*local_110->_vptr_SharedPtrStateBase[1])();
      }
      local_110 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar4) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"out1","");
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_108);
  if (local_e8.out1.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
      m_state != local_110) {
    if (local_e8.out1.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
        .m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e8.out1.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                .m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8.out1.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
        .m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
        (*(local_e8.out1.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e8.out1.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                .m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_e8.out1.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_e8.out1.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_e8.out1.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
    m_state = local_110;
    local_e8.out1.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
    m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)in_stack_fffffffffffffee8;
    if (local_110 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_110->strongRefCount = local_110->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_110->weakRefCount = local_110->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      in_stack_fffffffffffffee8 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_110 != (SharedPtrStateBase *)0x0) {
        (*local_110->_vptr_SharedPtrStateBase[1])();
      }
      local_110 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar4) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in0","");
  variable<tcu::Matrix<float,3,2>>((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_108);
  if (local_e8.in0.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
      m_state != local_110) {
    if (local_e8.in0.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
        .m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e8.in0.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                .m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8.in0.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
        .m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)0x0;
        (*(local_e8.in0.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e8.in0.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
                .m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_e8.in0.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_e8.in0.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>
          .m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_e8.in0.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
    m_state = local_110;
    local_e8.in0.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_3,_2>_>_>.
    m_ptr = (Variable<tcu::Matrix<float,_3,_2>_> *)in_stack_fffffffffffffee8;
    if (local_110 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_110->strongRefCount = local_110->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_110->weakRefCount = local_110->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      in_stack_fffffffffffffee8 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_110 != (SharedPtrStateBase *)0x0) {
        (*local_110->_vptr_SharedPtrStateBase[1])();
      }
      local_110 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar4) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in1","");
  variable<deqp::gls::BuiltinPrecisionTests::Void>
            ((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_108);
  if (local_e8.in1.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_state != local_110) {
    if (local_e8.in1.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e8.in1.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8.in1.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
        (*(local_e8.in1.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e8.in1.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_e8.in1.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_e8.in1.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_e8.in1.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
    .m_state = local_110;
    local_e8.in1.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
    .m_ptr = in_stack_fffffffffffffee8;
    if (local_110 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_110->strongRefCount = local_110->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_110->weakRefCount = local_110->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      in_stack_fffffffffffffee8 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_110 != (SharedPtrStateBase *)0x0) {
        (*local_110->_vptr_SharedPtrStateBase[1])();
      }
      local_110 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar4) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in2","");
  variable<deqp::gls::BuiltinPrecisionTests::Void>
            ((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_108);
  if (local_e8.in2.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_state != local_110) {
    if (local_e8.in2.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e8.in2.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8.in2.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
        (*(local_e8.in2.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e8.in2.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_e8.in2.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_e8.in2.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_e8.in2.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
    .m_state = local_110;
    local_e8.in2.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
    .m_ptr = in_stack_fffffffffffffee8;
    if (local_110 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_110->strongRefCount = local_110->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_110->weakRefCount = local_110->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      in_stack_fffffffffffffee8 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_110 != (SharedPtrStateBase *)0x0) {
        (*local_110->_vptr_SharedPtrStateBase[1])();
      }
      local_110 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar4) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_108._M_dataplus._M_p = (pointer)paVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"in3","");
  variable<deqp::gls::BuiltinPrecisionTests::Void>
            ((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_108);
  if (local_e8.in3.
      super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
      .m_state != local_110) {
    if (local_e8.in3.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &(local_e8.in3.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state)->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_e8.in3.
        super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
        .m_ptr = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
        (*(local_e8.in3.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &(local_e8.in3.
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                .m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if ((*pdVar1 == 0) &&
         (local_e8.in3.
          super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state != (SharedPtrStateBase *)0x0)) {
        (*(local_e8.in3.
           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
          .m_state)->_vptr_SharedPtrStateBase[1])();
      }
    }
    local_e8.in3.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
    .m_state = local_110;
    local_e8.in3.
    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
    .m_ptr = in_stack_fffffffffffffee8;
    if (local_110 != (SharedPtrStateBase *)0x0) {
      LOCK();
      local_110->strongRefCount = local_110->strongRefCount + 1;
      UNLOCK();
      LOCK();
      local_110->weakRefCount = local_110->weakRefCount + 1;
      UNLOCK();
    }
  }
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      in_stack_fffffffffffffee8 = (Variable<deqp::gls::BuiltinPrecisionTests::Void> *)0x0;
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (local_110 != (SharedPtrStateBase *)0x0) {
        (*local_110->_vptr_SharedPtrStateBase[1])();
      }
      local_110 = (SharedPtrStateBase *)0x0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar4) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  applyVar<deqp::gls::BuiltinPrecisionTests::Signature<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>>
            ((BuiltinPrecisionTests *)&local_108,this->m_func,&local_e8.in0,&local_e8.out1,
             &local_e8.in1,&local_e8.in2);
  variableStatement<tcu::Matrix<float,3,2>>
            ((BuiltinPrecisionTests *)&stack0xfffffffffffffee8,&local_e8.out0,
             (ExprP<tcu::Matrix<float,_3,_2>_> *)&local_108,false);
  PrecisionCase::
  testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,3,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,3,2>,tcu::Matrix<float,3,2>>>
            ((PrecisionCase *)this,&local_e8,&local_88,(Statement *)in_stack_fffffffffffffee8);
  if (local_110 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &local_110->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      (*local_110->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &local_110->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if ((*pdVar1 == 0) && (local_110 != (SharedPtrStateBase *)0x0)) {
      (*local_110->_vptr_SharedPtrStateBase[1])();
    }
  }
  if ((long *)local_108._M_string_length != (long *)0x0) {
    LOCK();
    plVar2 = (long *)(local_108._M_string_length + 8);
    *(int *)plVar2 = (int)*plVar2 + -1;
    UNLOCK();
    if ((int)*plVar2 == 0) {
      local_108._M_dataplus._M_p = (pointer)0x0;
      (**(code **)(*(long *)local_108._M_string_length + 0x10))();
    }
    LOCK();
    lVar3 = local_108._M_string_length + 0xc;
    *(int *)lVar3 = *(int *)lVar3 + -1;
    UNLOCK();
    if (*(int *)lVar3 == 0) {
      if ((long *)local_108._M_string_length != (long *)0x0) {
        (**(code **)(*(long *)local_108._M_string_length + 8))();
      }
      local_108._M_string_length = 0;
    }
  }
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_3,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_3,_2>,_tcu::Matrix<float,_3,_2>_>_>
  ::~Variables(&local_e8);
  if (local_88.in3.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.in3.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.in3.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.in3.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.in2.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.in2.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.in2.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.in2.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.in1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.in1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.in1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.in1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_88.in0.
      super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_88.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_2>,_std::allocator<tcu::Matrix<float,_3,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InOutFuncCase<Sig>::runTest (void)
{
	const Inputs<In>	inputs	(generateInputs(getSamplings(),
												m_ctx.floatFormat,
												m_ctx.precision,
												m_ctx.numRandoms,
												m_rnd));
	Variables<In, Out>	variables;

	variables.out0	= variable<Ret>("out0");
	variables.out1	= variable<Arg1>("out1");
	variables.in0	= variable<Arg0>("in0");
	variables.in1	= variable<Arg2>("in1");
	variables.in2	= variable<Arg3>("in2");
	variables.in3	= variable<Void>("in3");

	{
		ExprP<Ret>	expr	= applyVar(m_func,
									   variables.in0, variables.out1,
									   variables.in1, variables.in2);
		StatementP	stmt	= variableAssignment(variables.out0, expr);

		this->testStatement(variables, inputs, *stmt);
	}
}